

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall diligent_spirv_cross::CompilerGLSL::replace_fragment_outputs(CompilerGLSL *this)

{
  anon_class_8_1_8991fb9c local_18;
  CompilerGLSL *local_10;
  CompilerGLSL *this_local;
  
  local_18.this = this;
  local_10 = this;
  ParsedIR::
  for_each_typed_id<diligent_spirv_cross::SPIRVariable,diligent_spirv_cross::CompilerGLSL::replace_fragment_outputs()::__0>
            (&(this->super_Compiler).ir,&local_18);
  return;
}

Assistant:

void CompilerGLSL::replace_fragment_outputs()
{
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);

		if (!is_builtin_variable(var) && !var.remapped_variable && type.pointer && var.storage == StorageClassOutput)
			replace_fragment_output(var);
	});
}